

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_iterator.hpp
# Opt level: O2

void __thiscall
burst::
merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>
::increment(merge_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<int_*>_*,_std::vector<boost::iterator_range<int_*>,_std::allocator<boost::iterator_range<int_*>_>_>_>,_std::less<void>_>
            *this)

{
  iterator_range<int_*> *piVar1;
  int *piVar2;
  compose_fn<burst::apply_fn<burst::invert_t<std::less<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
  unaff_EBX;
  compose_fn<burst::apply_fn<burst::invert_t<std::less<void>_>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
  in_stack_00000008;
  
  std::
  pop_heap<__gnu_cxx::__normal_iterator<boost::iterator_range<int*>*,std::vector<boost::iterator_range<int*>,std::allocator<boost::iterator_range<int*>>>>,burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
            ((this->m_begin)._M_current,(this->m_end)._M_current,unaff_EBX);
  piVar1 = (this->m_end)._M_current;
  piVar2 = piVar1[-1].
           super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
           super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin +
           1;
  piVar1[-1].super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
  super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
  super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.m_Begin = piVar2;
  if (piVar2 != piVar1[-1].
                super_iterator_range_base<int_*,_boost::iterators::random_access_traversal_tag>.
                super_iterator_range_base<int_*,_boost::iterators::bidirectional_traversal_tag>.
                super_iterator_range_base<int_*,_boost::iterators::incrementable_traversal_tag>.
                m_End) {
    std::
    push_heap<__gnu_cxx::__normal_iterator<boost::iterator_range<int*>*,std::vector<boost::iterator_range<int*>,std::allocator<boost::iterator_range<int*>>>>,burst::compose_fn<burst::apply_fn<burst::invert_t<std::less<void>>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
              ((this->m_begin)._M_current,(this->m_end)._M_current,in_stack_00000008);
    return;
  }
  (this->m_end)._M_current = (this->m_end)._M_current + -1;
  return;
}

Assistant:

void increment ()
        {
            std::pop_heap(m_begin, m_end, each(front) | invert(m_compare));
            auto & range = *std::prev(m_end);

            range.advance_begin(1);
            if (not range.empty())
            {
                std::push_heap(m_begin, m_end, each(front) | invert(m_compare));
            }
            else
            {
                --m_end;
            }
        }